

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

LY_ERR range_part_check_ascendancy
                 (ly_bool unsigned_value,ly_bool max,int64_t value,int64_t prev_value)

{
  bool bVar1;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,unsigned_value) == 0) {
    bVar1 = prev_value <= value;
    if (max == '\0') {
      bVar1 = prev_value < value;
    }
  }
  else {
    bVar1 = (ulong)prev_value <= (ulong)value;
    if (max == '\0') {
      bVar1 = (ulong)prev_value < (ulong)value;
    }
  }
  if (!bVar1) {
    return LY_EEXIST;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
range_part_check_ascendancy(ly_bool unsigned_value, ly_bool max, int64_t value, int64_t prev_value)
{
    if (unsigned_value) {
        if ((max && ((uint64_t)prev_value > (uint64_t)value)) || (!max && ((uint64_t)prev_value >= (uint64_t)value))) {
            return LY_EEXIST;
        }
    } else {
        if ((max && (prev_value > value)) || (!max && (prev_value >= value))) {
            return LY_EEXIST;
        }
    }
    return LY_SUCCESS;
}